

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_cell_query_base.h
# Opt level: O0

void __thiscall
S2ClosestCellQueryBase<S2MinDistance>::AddRange
          (S2ClosestCellQueryBase<S2MinDistance> *this,RangeIterator *range)

{
  bool bVar1;
  Label label;
  S2CellId cell_id;
  RangeIterator *range_local;
  S2ClosestCellQueryBase<S2MinDistance> *this_local;
  
  S2CellIndex::ContentsIterator::StartUnion(&this->contents_it_,range);
  while( true ) {
    bVar1 = S2CellIndex::ContentsIterator::done(&this->contents_it_);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    cell_id = S2CellIndex::ContentsIterator::cell_id(&this->contents_it_);
    label = S2CellIndex::ContentsIterator::label(&this->contents_it_);
    MaybeAddResult(this,cell_id,label);
    S2CellIndex::ContentsIterator::Next(&this->contents_it_);
  }
  return;
}

Assistant:

void S2ClosestCellQueryBase<Distance>::AddRange(const RangeIterator& range) {
  for (contents_it_.StartUnion(range);
       !contents_it_.done(); contents_it_.Next()) {
    MaybeAddResult(contents_it_.cell_id(), contents_it_.label());
  }
}